

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 *pos,ImU32 col,ImWchar c)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ushort uVar5;
  ulong uVar6;
  uint col_00;
  undefined6 in_register_00000082;
  ImFontGlyph *pIVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  
  uVar6 = CONCAT62(in_register_00000082,c) & 0xffffffff;
  if ((uVar6 < (ulong)(long)(this->IndexLookup).Size) &&
     (uVar5 = (this->IndexLookup).Data[uVar6], uVar5 != 0xffff)) {
    pIVar7 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar5 * 0x28);
  }
  else {
    pIVar7 = this->FallbackGlyph;
  }
  if ((pIVar7 != (ImFontGlyph *)0x0) &&
     (((undefined1  [40])*pIVar7 & (undefined1  [40])0x2) != (undefined1  [40])0x0)) {
    col_00 = col | 0xffffff;
    if (((undefined1  [40])*pIVar7 & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      col_00 = col;
    }
    fVar8 = (float)(-(uint)(size < 0.0) & 0x3f800000 |
                   ~-(uint)(size < 0.0) & (uint)(size / this->FontSize));
    fVar9 = (float)(int)(*pos).x;
    fVar10 = (float)(int)(*pos).y;
    ImDrawList::PrimReserve(draw_list,6,4);
    uVar1 = pIVar7->X0;
    uVar3 = pIVar7->Y0;
    local_20.x = (float)uVar1 * fVar8 + fVar9;
    local_20.y = (float)uVar3 * fVar8 + fVar10;
    uVar2 = pIVar7->X1;
    uVar4 = pIVar7->Y1;
    local_28.x = (float)uVar2 * fVar8 + fVar9;
    local_28.y = (float)uVar4 * fVar8 + fVar10;
    local_30.x = pIVar7->U0;
    local_30.y = pIVar7->V0;
    local_38.x = pIVar7->U1;
    local_38.y = pIVar7->V1;
    ImDrawList::PrimRectUV(draw_list,&local_20,&local_28,&local_30,&local_38,col_00);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, const ImVec2& pos, ImU32 col, ImWchar c) const
{
    const ImFontGlyph* glyph = FindGlyph(c);
    if (!glyph || !glyph->Visible)
        return;
    if (glyph->Colored)
        col |= ~IM_COL32_A_MASK;
    float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
    float x = IM_FLOOR(pos.x);
    float y = IM_FLOOR(pos.y);
    draw_list->PrimReserve(6, 4);
    draw_list->PrimRectUV(ImVec2(x + glyph->X0 * scale, y + glyph->Y0 * scale), ImVec2(x + glyph->X1 * scale, y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
}